

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveStream(AsyncCapabilityStream *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  long *in_RSI;
  ResultHolder *ptrCopy;
  TransformPromiseNodeBase *this_00;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  OwnPromiseNode local_30;
  
  pPVar3 = (PromiseArena *)operator_new(0x18);
  pPVar3->bytes[0] = '\0';
  pPVar3->bytes[1] = '\0';
  pPVar3->bytes[2] = '\0';
  pPVar3->bytes[3] = '\0';
  pPVar3->bytes[4] = '\0';
  pPVar3->bytes[5] = '\0';
  pPVar3->bytes[6] = '\0';
  pPVar3->bytes[7] = '\0';
  pPVar3->bytes[8] = '\0';
  pPVar3->bytes[9] = '\0';
  pPVar3->bytes[10] = '\0';
  pPVar3->bytes[0xb] = '\0';
  pPVar3->bytes[0xc] = '\0';
  pPVar3->bytes[0xd] = '\0';
  pPVar3->bytes[0xe] = '\0';
  pPVar3->bytes[0xf] = '\0';
  pPVar3->bytes[0x10] = '\0';
  pPVar3->bytes[0x11] = '\0';
  pPVar3->bytes[0x12] = '\0';
  pPVar3->bytes[0x13] = '\0';
  pPVar3->bytes[0x14] = '\0';
  pPVar3->bytes[0x15] = '\0';
  pPVar3->bytes[0x16] = '\0';
  pPVar3->bytes[0x17] = '\0';
  (**(code **)(*in_RSI + 0x88))(&local_30);
  OVar2.ptr = local_30.ptr;
  pPVar1 = ((local_30.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_30.ptr - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_30,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2607:23)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_006e0d70;
    *(undefined8 **)((long)pvVar4 + 0x3f0) =
         &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveStream()::ResultHolder>::instance
    ;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((local_30.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_30.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_30,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2607:23)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006e0d70;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)
         &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveStream()::ResultHolder>::instance
    ;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar3;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  OVar2.ptr = local_30.ptr;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)this_00;
  if (&(local_30.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Maybe<Own<AsyncCapabilityStream>>> AsyncCapabilityStream::tryReceiveStream() {
  struct ResultHolder {
    byte b;
    Own<AsyncCapabilityStream> stream;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithStreams(&result->b, 1, 1, &result->stream, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<Own<AsyncCapabilityStream>> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a capability (e.g. file descriptor via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->stream);
  });
}